

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O3

void __thiscall
cmGlobalNinjaGenerator::WriteBuild
          (cmGlobalNinjaGenerator *this,ostream *os,string *comment,string *rule,
          cmNinjaDeps *outputs,cmNinjaDeps *explicitDeps,cmNinjaDeps *implicitDeps,
          cmNinjaDeps *orderOnlyDeps,cmNinjaVars *variables,string *rspfile,int cmdLineLimit,
          bool *usedResponseFile)

{
  bool bVar1;
  long *plVar2;
  _Rb_tree_header *p_Var3;
  _Rb_tree_node_base *p_Var4;
  ostream *poVar5;
  string *psVar6;
  char *pcVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  pointer m2;
  char *__end;
  pointer path;
  string arguments;
  string assignments;
  ostringstream variable_assignments;
  string local_2b8;
  string local_298;
  ostream *local_278;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_270;
  char *local_268;
  long local_260;
  char local_258;
  undefined7 uStack_257;
  string local_248;
  cmNinjaDeps *local_228;
  string local_220;
  uint local_1fc;
  cmNinjaDeps *local_1f8;
  cmGlobalNinjaGenerator *local_1f0;
  string *local_1e8;
  bool *local_1e0;
  cmNinjaVars *local_1d8;
  string *local_1d0;
  string local_1c8;
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  local_278 = os;
  local_1f0 = this;
  local_1d0 = rule;
  if (rule->_M_string_length == 0) {
    m2 = (comment->_M_dataplus)._M_p;
    pcVar7 = "No rule for WriteBuildStatement! called with comment: ";
  }
  else {
    local_1f8 = outputs;
    if ((outputs->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start !=
        (outputs->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      local_1e0 = usedResponseFile;
      local_1fc = cmdLineLimit;
      local_1e8 = rspfile;
      local_1d8 = variables;
      local_228 = orderOnlyDeps;
      local_270 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                   *)implicitDeps;
      WriteComment(os,comment);
      local_268 = &local_258;
      local_260 = 0;
      local_258 = '\0';
      path = (explicitDeps->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
      if (path != (explicitDeps->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish) {
        do {
          EncodePath(&local_2b8,(cmGlobalNinjaGenerator *)comment,path);
          EncodeIdent(&local_298,&local_2b8,local_278);
          plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_298,0,(char *)0x0,0x4c24a8);
          paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(plVar2 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar2 == paVar8) {
            local_198[0]._0_8_ = paVar8->_M_allocated_capacity;
            local_198[0]._8_8_ = plVar2[3];
            local_1a8._0_8_ = local_198;
          }
          else {
            local_198[0]._0_8_ = paVar8->_M_allocated_capacity;
            local_1a8._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*plVar2;
          }
          local_1a8._8_8_ = plVar2[1];
          *plVar2 = (long)paVar8;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          comment = (string *)local_1a8._0_8_;
          std::__cxx11::string::_M_append((char *)&local_268,local_1a8._0_8_);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._0_8_ != local_198) {
            comment = (string *)(local_198[0]._M_allocated_capacity + 1);
            operator_delete((void *)local_1a8._0_8_,(ulong)comment);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_298._M_dataplus._M_p != &local_298.field_2) {
            comment = (string *)
                      (CONCAT71(local_298.field_2._M_allocated_capacity._1_7_,
                                local_298.field_2._M_local_buf[0]) + 1);
            operator_delete(local_298._M_dataplus._M_p,(ulong)comment);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
            comment = (string *)(local_2b8.field_2._M_allocated_capacity + 1);
            operator_delete(local_2b8._M_dataplus._M_p,(ulong)comment);
          }
          path = path + 1;
        } while (path != (explicitDeps->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish);
      }
      if (*(long *)local_270 != *(long *)(local_270 + 8)) {
        pcVar7 = " |";
        std::__cxx11::string::append((char *)&local_268);
        psVar6 = *(string **)local_270;
        if (psVar6 != *(string **)(local_270 + 8)) {
          do {
            EncodePath(&local_2b8,(cmGlobalNinjaGenerator *)pcVar7,psVar6);
            EncodeIdent(&local_298,&local_2b8,local_278);
            plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_298,0,(char *)0x0,0x4c24a8)
            ;
            paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(plVar2 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar2 == paVar8) {
              local_198[0]._0_8_ = paVar8->_M_allocated_capacity;
              local_198[0]._8_8_ = plVar2[3];
              local_1a8._0_8_ = local_198;
            }
            else {
              local_198[0]._0_8_ = paVar8->_M_allocated_capacity;
              local_1a8._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*plVar2;
            }
            local_1a8._8_8_ = plVar2[1];
            *plVar2 = (long)paVar8;
            plVar2[1] = 0;
            *(undefined1 *)(plVar2 + 2) = 0;
            pcVar7 = (char *)local_1a8._0_8_;
            std::__cxx11::string::_M_append((char *)&local_268,local_1a8._0_8_);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8._0_8_ != local_198) {
              pcVar7 = (char *)(local_198[0]._M_allocated_capacity + 1);
              operator_delete((void *)local_1a8._0_8_,(ulong)pcVar7);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_298._M_dataplus._M_p != &local_298.field_2) {
              pcVar7 = (char *)(CONCAT71(local_298.field_2._M_allocated_capacity._1_7_,
                                         local_298.field_2._M_local_buf[0]) + 1);
              operator_delete(local_298._M_dataplus._M_p,(ulong)pcVar7);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
              pcVar7 = (char *)(local_2b8.field_2._M_allocated_capacity + 1);
              operator_delete(local_2b8._M_dataplus._M_p,(ulong)pcVar7);
            }
            psVar6 = psVar6 + 1;
          } while (psVar6 != *(string **)(local_270 + 8));
        }
      }
      if ((local_228->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start !=
          (local_228->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish) {
        pcVar7 = " ||";
        std::__cxx11::string::append((char *)&local_268);
        psVar6 = (local_228->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if (psVar6 != (local_228->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish) {
          do {
            EncodePath(&local_2b8,(cmGlobalNinjaGenerator *)pcVar7,psVar6);
            EncodeIdent(&local_298,&local_2b8,local_278);
            plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_298,0,(char *)0x0,0x4c24a8)
            ;
            paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(plVar2 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar2 == paVar8) {
              local_198[0]._0_8_ = paVar8->_M_allocated_capacity;
              local_198[0]._8_8_ = plVar2[3];
              local_1a8._0_8_ = local_198;
            }
            else {
              local_198[0]._0_8_ = paVar8->_M_allocated_capacity;
              local_1a8._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*plVar2;
            }
            local_1a8._8_8_ = plVar2[1];
            *plVar2 = (long)paVar8;
            plVar2[1] = 0;
            *(undefined1 *)(plVar2 + 2) = 0;
            pcVar7 = (char *)local_1a8._0_8_;
            std::__cxx11::string::_M_append((char *)&local_268,local_1a8._0_8_);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8._0_8_ != local_198) {
              pcVar7 = (char *)(local_198[0]._M_allocated_capacity + 1);
              operator_delete((void *)local_1a8._0_8_,(ulong)pcVar7);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_298._M_dataplus._M_p != &local_298.field_2) {
              pcVar7 = (char *)(CONCAT71(local_298.field_2._M_allocated_capacity._1_7_,
                                         local_298.field_2._M_local_buf[0]) + 1);
              operator_delete(local_298._M_dataplus._M_p,(ulong)pcVar7);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
              pcVar7 = (char *)(local_2b8.field_2._M_allocated_capacity + 1);
              operator_delete(local_2b8._M_dataplus._M_p,(ulong)pcVar7);
            }
            psVar6 = psVar6 + 1;
          } while (psVar6 != (local_228->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish);
        }
      }
      std::__cxx11::string::append((char *)&local_268);
      local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
      local_298._M_string_length = 0;
      local_298.field_2._M_local_buf[0] = '\0';
      paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x4a4006;
      std::__cxx11::string::append((char *)&local_298);
      psVar6 = (local_1f8->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (psVar6 != (local_1f8->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish) {
        local_270 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                     *)&local_1f0->CombinedBuildOutputs;
        do {
          EncodePath(&local_220,(cmGlobalNinjaGenerator *)paVar8,psVar6);
          EncodeIdent(&local_2b8,&local_220,local_278);
          plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_2b8,0,(char *)0x0,0x4c24a8);
          paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(plVar2 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar2 == paVar8) {
            local_198[0]._0_8_ = paVar8->_M_allocated_capacity;
            local_198[0]._8_8_ = plVar2[3];
            local_1a8._0_8_ = local_198;
          }
          else {
            local_198[0]._0_8_ = paVar8->_M_allocated_capacity;
            local_1a8._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*plVar2;
          }
          local_1a8._8_8_ = plVar2[1];
          *plVar2 = (long)paVar8;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_1a8._0_8_;
          std::__cxx11::string::_M_append((char *)&local_298,local_1a8._0_8_);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._0_8_ != local_198) {
            paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(local_198[0]._M_allocated_capacity + 1);
            operator_delete((void *)local_1a8._0_8_,(ulong)paVar8);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
            paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(local_2b8.field_2._M_allocated_capacity + 1);
            operator_delete(local_2b8._M_dataplus._M_p,(ulong)paVar8);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_220._M_dataplus._M_p != &local_220.field_2) {
            paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(local_220.field_2._M_allocated_capacity + 1);
            operator_delete(local_220._M_dataplus._M_p,(ulong)paVar8);
          }
          if (local_1f0->ComputingUnknownDependencies == true) {
            EncodePath((string *)local_1a8,(cmGlobalNinjaGenerator *)paVar8,psVar6);
            paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_1a8;
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string>
                      (local_270,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1a8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8._0_8_ != local_198) {
              paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(local_198[0]._M_allocated_capacity + 1);
              operator_delete((void *)local_1a8._0_8_,(ulong)paVar8);
            }
          }
          psVar6 = psVar6 + 1;
        } while (psVar6 != (local_1f8->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish);
      }
      std::__cxx11::string::append((char *)&local_298);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                     " ",local_1d0);
      std::__cxx11::string::_M_append((char *)&local_298,local_1a8._0_8_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._0_8_ != local_198) {
        operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      p_Var4 = (local_1d8->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var3 = &(local_1d8->_M_t)._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var4 != p_Var3) {
        do {
          local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"","");
          WriteVariable((ostream *)local_1a8,(string *)(p_Var4 + 1),(string *)(p_Var4 + 2),
                        &local_2b8,1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
            operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
          }
          p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
        } while ((_Rb_tree_header *)p_Var4 != p_Var3);
      }
      local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2b8,local_298._M_dataplus._M_p,
                 local_298._M_dataplus._M_p + local_298._M_string_length);
      std::__cxx11::stringbuf::str();
      if (((int)local_1fc < 1) ||
         (local_2b8._M_string_length + local_260 + local_220._M_string_length <= (ulong)local_1fc))
      {
        bVar1 = false;
      }
      else {
        paVar8 = &local_248.field_2;
        local_248._M_string_length = 0;
        local_248.field_2._M_local_buf[0] = '\0';
        local_248._M_dataplus._M_p = (pointer)paVar8;
        std::__cxx11::stringbuf::str((string *)(local_1a8 + 8));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != paVar8) {
          operator_delete(local_248._M_dataplus._M_p,
                          CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                                   local_248.field_2._M_local_buf[0]) + 1);
        }
        local_248._M_dataplus._M_p = (pointer)paVar8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"RSP_FILE","");
        local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"");
        WriteVariable((ostream *)local_1a8,&local_248,local_1e8,&local_1c8,1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != paVar8) {
          operator_delete(local_248._M_dataplus._M_p,
                          CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                                   local_248.field_2._M_local_buf[0]) + 1);
        }
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::_M_append((char *)&local_220,(ulong)local_248._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != paVar8) {
          operator_delete(local_248._M_dataplus._M_p,
                          CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                                   local_248.field_2._M_local_buf[0]) + 1);
        }
        bVar1 = true;
      }
      if (local_1e0 != (bool *)0x0) {
        *local_1e0 = bVar1;
      }
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_278,local_2b8._M_dataplus._M_p,local_2b8._M_string_length);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_268,local_260);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,local_220._M_dataplus._M_p,local_220._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p != &local_220.field_2) {
        operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,
                        CONCAT71(local_298.field_2._M_allocated_capacity._1_7_,
                                 local_298.field_2._M_local_buf[0]) + 1);
      }
      if (local_268 != &local_258) {
        operator_delete(local_268,CONCAT71(uStack_257,local_258) + 1);
      }
      return;
    }
    m2 = (comment->_M_dataplus)._M_p;
    pcVar7 = "No output files for WriteBuildStatement! called with comment: ";
  }
  cmSystemTools::Error(pcVar7,m2,(char *)0x0,(char *)0x0);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::WriteBuild(std::ostream& os,
                                        const std::string& comment,
                                        const std::string& rule,
                                        const cmNinjaDeps& outputs,
                                        const cmNinjaDeps& explicitDeps,
                                        const cmNinjaDeps& implicitDeps,
                                        const cmNinjaDeps& orderOnlyDeps,
                                        const cmNinjaVars& variables,
                                        const std::string& rspfile,
                                        int cmdLineLimit,
                                        bool* usedResponseFile)
{
  // Make sure there is a rule.
  if(rule.empty())
    {
    cmSystemTools::Error("No rule for WriteBuildStatement! called "
                         "with comment: ",
                         comment.c_str());
    return;
    }

  // Make sure there is at least one output file.
  if(outputs.empty())
    {
    cmSystemTools::Error("No output files for WriteBuildStatement! called "
                         "with comment: ",
                         comment.c_str());
    return;
    }

  cmGlobalNinjaGenerator::WriteComment(os, comment);

  std::string arguments;

  // TODO: Better formatting for when there are multiple input/output files.

  // Write explicit dependencies.
  for(cmNinjaDeps::const_iterator i = explicitDeps.begin();
      i != explicitDeps.end();
      ++i)
    {
    arguments += " " + EncodeIdent(EncodePath(*i), os);
    }

  // Write implicit dependencies.
  if(!implicitDeps.empty())
    {
    arguments += " |";
    for(cmNinjaDeps::const_iterator i = implicitDeps.begin();
        i != implicitDeps.end();
        ++i)
      arguments += " " + EncodeIdent(EncodePath(*i), os);
    }

  // Write order-only dependencies.
  if(!orderOnlyDeps.empty())
    {
    arguments += " ||";
    for(cmNinjaDeps::const_iterator i = orderOnlyDeps.begin();
        i != orderOnlyDeps.end();
        ++i)
      arguments += " " + EncodeIdent(EncodePath(*i), os);
    }

  arguments += "\n";

  std::string build;

  // Write outputs files.
  build += "build";
  for(cmNinjaDeps::const_iterator i = outputs.begin();
      i != outputs.end(); ++i)
    {
    build += " " + EncodeIdent(EncodePath(*i), os);
    if (this->ComputingUnknownDependencies)
      {
      this->CombinedBuildOutputs.insert( EncodePath(*i) );
      }
    }
  build += ":";

  // Write the rule.
  build += " " + rule;

  // Write the variables bound to this build statement.
  std::ostringstream variable_assignments;
  for(cmNinjaVars::const_iterator i = variables.begin();
      i != variables.end(); ++i)
    cmGlobalNinjaGenerator::WriteVariable(variable_assignments,
                                          i->first, i->second, "", 1);

  // check if a response file rule should be used
  std::string buildstr = build;
  std::string assignments = variable_assignments.str();
  const std::string& args = arguments;
  bool useResponseFile = false;
  if (cmdLineLimit > 0
      && args.size() + buildstr.size() + assignments.size()
                                                    > (size_t) cmdLineLimit) {
    variable_assignments.str(std::string());
    cmGlobalNinjaGenerator::WriteVariable(variable_assignments,
                                          "RSP_FILE", rspfile, "", 1);
    assignments += variable_assignments.str();
    useResponseFile = true;
  }
  if (usedResponseFile)
    {
    *usedResponseFile = useResponseFile;
    }

  os << buildstr << args << assignments;
}